

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O0

string * cppcms::encoding::from_utf8_abi_cxx11_(char *c_encoding,char *begin,char *end)

{
  bool bVar1;
  string *in_RCX;
  char *in_RDX;
  char *in_RSI;
  string *in_RDI;
  string result;
  char *in_stack_ffffffffffffff60;
  allocator local_71;
  string local_70 [32];
  undefined4 local_50;
  string local_40 [32];
  string *local_20;
  char *local_18;
  char *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_40);
  bVar1 = is_utf8(in_stack_ffffffffffffff60);
  if (bVar1) {
    std::__cxx11::string::assign((char *)local_40,(ulong)local_18);
    std::__cxx11::string::string((string *)in_RDI,local_40);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,local_10,&local_71);
    booster::locale::conv::from_utf<char>((char *)in_RDI,local_18,local_20,(method_type)local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  local_50 = 1;
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

std::string CPPCMS_API from_utf8(char const *c_encoding,char const *begin,char const *end)
{
	std::string result;
	if(is_utf8(c_encoding)) {
		result.assign(begin,end-begin);
		return result;
	}
	return locale::conv::from_utf<char>(begin,end,c_encoding);
}